

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString StringFrom(double value,int precision)

{
  int iVar1;
  size_t extraout_RDX;
  uint in_ESI;
  char *otherBuffer;
  undefined4 in_register_0000003c;
  SimpleString *this;
  SimpleString SVar3;
  size_t sVar2;
  
  this = (SimpleString *)CONCAT44(in_register_0000003c,precision);
  iVar1 = (*PlatformSpecificIsNan)(value);
  if (iVar1 == 0) {
    iVar1 = (*PlatformSpecificIsInf)(value);
    if (iVar1 == 0) {
      SVar3 = StringFromFormat((char *)this,SUB84(value,0),"%.*g",(ulong)in_ESI);
      sVar2 = SVar3.bufferSize_;
      goto LAB_0013442d;
    }
    this->buffer_ = (char *)0x0;
    this->bufferSize_ = 0;
    otherBuffer = "Inf - Infinity";
  }
  else {
    this->buffer_ = (char *)0x0;
    this->bufferSize_ = 0;
    otherBuffer = "Nan - Not a number";
  }
  SimpleString::copyBufferToNewInternalBuffer(this,otherBuffer);
  sVar2 = extraout_RDX;
LAB_0013442d:
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString StringFrom(double value, int precision)
{
    if (PlatformSpecificIsNan(value))
        return "Nan - Not a number";
    else if (PlatformSpecificIsInf(value))
        return "Inf - Infinity";
    else
        return StringFromFormat("%.*g", precision, value);
}